

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O1

unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> __thiscall
spvtools::opt::InlinePass::AddGuardBlock
          (InlinePass *this,
          vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
          *new_blocks,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *callee2caller,
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          *new_blk_ptr,uint32_t entry_blk_label_id)

{
  pointer puVar1;
  BasicBlock *__ptr;
  _func_int **pp_Var2;
  uint32_t label_id;
  pointer __p;
  undefined8 *puVar3;
  mapped_type *pmVar4;
  Function *pFVar5;
  undefined4 in_register_00000084;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> this_00;
  string message;
  size_type __dnew;
  key_type local_84;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
  *local_80;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_78;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_70;
  BasicBlock *local_68;
  Function *local_60;
  undefined1 local_58 [16];
  Function *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  this_00._M_head_impl._4_4_ = in_register_00000084;
  this_00._M_head_impl._0_4_ = entry_blk_label_id;
  puVar1 = new_blocks[1].
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_70 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)new_blk_ptr;
  label_id = Module::TakeNextIdBound
                       ((Module *)
                        puVar1[6]._M_t.
                        super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                        .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl);
  if ((label_id == 0) &&
     (puVar1[9]._M_t.
      super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
      .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl != (BasicBlock *)0x0))
  {
    local_68 = (BasicBlock *)local_58;
    local_48 = (Function *)0x25;
    local_80 = (vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
                *)callee2caller;
    local_78._M_head_impl = (BasicBlock *)this;
    local_68 = (BasicBlock *)
               std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&stack0xffffffffffffffb8);
    local_58._0_8_ = local_48;
    local_68->function_ = (Function *)0x667265766f204449;
    (local_68->label_)._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
         (Instruction *)0x797254202e776f6c;
    (local_68->insts_).super_IntrusiveList<spvtools::opt::Instruction>._vptr_IntrusiveList =
         (_func_int **)0x676e696e6e757220;
    (local_68->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
    super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
         (_func_int **)0x746361706d6f6320;
    *(undefined8 *)
     ((long)&(local_68->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
             super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase + 5) =
         0x2e7364692d746361;
    local_60 = local_48;
    *(char *)((long)&(local_48->def_inst_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                     .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false> +
             (long)&local_68->function_) = '\0';
    local_48 = (Function *)0x0;
    uStack_40 = (_func_int **)0x0;
    local_38 = (Instruction *)0x0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()((function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
                *)(puVar1 + 7),SPV_MSG_ERROR,"",(spv_position_t *)&stack0xffffffffffffffb8,
               (char *)local_68);
    callee2caller =
         (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *)local_80;
    this = (InlinePass *)local_78;
    if (local_68 != (BasicBlock *)local_58) {
      operator_delete(local_68,(ulong)((long)&(((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                                 *)local_58._0_8_)->_M_t).
                                              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                              .
                                              super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>
                                      + 1));
      callee2caller =
           (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
            *)local_80;
      this = (InlinePass *)local_78._M_head_impl;
    }
  }
  if (label_id == 0) {
    pFVar5 = (Function *)0x0;
    this_00._M_head_impl = (BasicBlock *)this;
  }
  else {
    AddBranch((InlinePass *)new_blocks,label_id,
              (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               *)this_00._M_head_impl);
    std::
    vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
    ::
    emplace_back<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>
              ((vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
                *)callee2caller,
               (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                *)this_00._M_head_impl);
    NewLabel((InlinePass *)&stack0xffffffffffffffb8,(uint32_t)new_blocks);
    puVar3 = (undefined8 *)operator_new(0x88);
    pp_Var2 = (_func_int **)local_48;
    local_48 = (Function *)0x0;
    *puVar3 = 0;
    puVar3[1] = pp_Var2;
    puVar3[4] = 0;
    puVar3[5] = 0;
    puVar3[3] = &PTR__Instruction_003e9ae0;
    *(undefined4 *)(puVar3 + 9) = 0;
    puVar3[7] = 0;
    *(undefined8 *)((long)puVar3 + 0x3e) = 0;
    puVar3[10] = 0;
    puVar3[0xb] = 0;
    puVar3[0xc] = 0;
    puVar3[0xd] = 0;
    puVar3[0xe] = 0;
    puVar3[0xf] = 0;
    puVar3[0x10] = 0;
    puVar3[4] = puVar3 + 3;
    puVar3[5] = puVar3 + 3;
    *(undefined1 *)(puVar3 + 6) = 1;
    puVar3[2] = &PTR__InstructionList_003e9b78;
    local_68 = (BasicBlock *)0x0;
    __ptr = *this_00._M_head_impl;
    *(undefined8 **)this_00._M_head_impl = puVar3;
    if (__ptr != (BasicBlock *)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)this_00._M_head_impl,__ptr);
    }
    if (local_68 != (BasicBlock *)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)&local_68,local_68);
    }
    pmVar4 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[](local_70,&local_84);
    *pmVar4 = label_id;
    pFVar5 = (this_00._M_head_impl)->function_;
  }
  ((BasicBlock *)this)->function_ = pFVar5;
  (this_00._M_head_impl)->function_ = 0;
  return (__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
          )(tuple<spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>)this
  ;
}

Assistant:

std::unique_ptr<BasicBlock> InlinePass::AddGuardBlock(
    std::vector<std::unique_ptr<BasicBlock>>* new_blocks,
    std::unordered_map<uint32_t, uint32_t>* callee2caller,
    std::unique_ptr<BasicBlock> new_blk_ptr, uint32_t entry_blk_label_id) {
  const auto guard_block_id = context()->TakeNextId();
  if (guard_block_id == 0) {
    return nullptr;
  }
  AddBranch(guard_block_id, &new_blk_ptr);
  new_blocks->push_back(std::move(new_blk_ptr));
  // Start the next block.
  new_blk_ptr = MakeUnique<BasicBlock>(NewLabel(guard_block_id));
  // Reset the mapping of the callee's entry block to point to
  // the guard block.  Do this so we can fix up phis later on to
  // satisfy dominance.
  (*callee2caller)[entry_blk_label_id] = guard_block_id;
  return new_blk_ptr;
}